

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.h
# Opt level: O2

bool __thiscall
Js::BuiltInPropertyRecord<11>::Equals(BuiltInPropertyRecord<11> *this,JavascriptString *str)

{
  charcount_t length;
  char16 *str_00;
  bool bVar1;
  long local_28;
  PropertyRecord *propRecord;
  
  local_28 = 0;
  (*(str->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(str,&local_28,0);
  if (local_28 == 0) {
    str_00 = JavascriptString::GetString(str);
    length = JavascriptString::GetLength(str);
    bVar1 = Equals(this,str_00,length);
  }
  else {
    bVar1 = *(int *)(local_28 + 8) == (this->propertyRecord).pid;
  }
  return bVar1;
}

Assistant:

bool Equals(JavascriptString * str) const
        {
            const PropertyRecord * propRecord = nullptr;
            str->GetPropertyRecord(&propRecord);

            if (propRecord == nullptr)
            {
                return Equals(str->GetString(), str->GetLength());
            }
            else
            {
                return Equals(propRecord->GetPropertyId());
            }
        }